

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void check_op<std::greater_equal>(void)

{
  char *__s;
  int iVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  basic_string_view<char> other;
  greater_equal<fmt::v5::basic_string_view<char>_> local_79;
  AssertHelper local_78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertionResult gtest_ar;
  string_view rhs;
  string_view lhs;
  
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    __s = (&PTR_anon_var_dwarf_2c7fe_001b6540)[lVar2];
    for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 8) {
      lhs.data_ = __s;
      lhs.size_ = strlen(__s);
      pcVar4 = *(char **)((long)&PTR_anon_var_dwarf_2c7fe_001b6540 + lVar3);
      rhs.data_ = pcVar4;
      rhs.size_ = strlen(pcVar4);
      other.size_ = rhs.size_;
      other.data_ = pcVar4;
      iVar1 = fmt::v5::basic_string_view<char>::compare(&lhs,other);
      local_70.ptr_._0_1_ = -1 < iVar1;
      local_78.data_._0_1_ =
           std::greater_equal<fmt::v5::basic_string_view<char>_>::operator()(&local_79,&lhs,&rhs);
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&gtest_ar,"Op<int>()(lhs.compare(rhs), 0)",
                 "Op<string_view>()(lhs, rhs)",(bool *)&local_70,(bool *)&local_78);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_70);
        pcVar4 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
                   ,0x1aa,pcVar4);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_70);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
  }
  return;
}

Assistant:

void check_op() {
  const char *inputs[] = {"foo", "fop", "fo"};
  std::size_t num_inputs = sizeof(inputs) / sizeof(*inputs);
  for (std::size_t i = 0; i < num_inputs; ++i) {
    for (std::size_t j = 0; j < num_inputs; ++j) {
      string_view lhs(inputs[i]), rhs(inputs[j]);
      EXPECT_EQ(Op<int>()(lhs.compare(rhs), 0), Op<string_view>()(lhs, rhs));
    }
  }
}